

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_parse_missing_value(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  int j;
  int i;
  char *args [4];
  cargo_t local_38;
  undefined1 local_30 [4];
  undefined1 local_2c [4];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  char *local_18;
  char *pcStack_10;
  
  iVar1 = cargo_init(&local_38,0,"program");
  if (iVar1 == 0) {
    local_18 = "1";
    pcStack_10 = "--beta";
    local_28 = 0x12ab1a;
    uStack_24 = 0;
    uStack_20 = 0x127e2d;
    uStack_1c = 0;
    cargo_add_option(local_38,0,"--alpha -a","The alpha","i",local_2c);
    iVar1 = cargo_add_option(local_38,0,"--beta -b","The beta","i",local_30);
    if (iVar1 == 0) {
      pcVar2 = (char *)0x0;
      iVar1 = cargo_parse(local_38,0,1,4,(char **)&local_28);
      if (iVar1 == 0) {
        pcVar2 = "Succesfully parsed missing value";
      }
    }
    else {
      pcVar2 = "Failed to add options";
    }
    cargo_destroy(&local_38);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_parse_missing_value)
{
    int i;
    int j;
    char *args[] = { "program", "--alpha", "1", "--beta" };

    ret = cargo_add_option(cargo, 0, "--alpha -a", "The alpha", "i", &i);
    ret = cargo_add_option(cargo, 0, "--beta -b", "The beta", "i", &j);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret != 0, "Succesfully parsed missing value");

    _TEST_CLEANUP();
}